

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::x86::X86RAPass::emitPreCall(X86RAPass *this,InvokeNode *invokeNode)

{
  uint uVar1;
  BaseBuilder *this_00;
  Error EVar2;
  uint uVar3;
  Error EVar4;
  undefined8 extraout_RAX;
  char cVar5;
  InstId instId;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 *puVar9;
  bool bVar10;
  Xmm src;
  Operand_ local_58;
  ulong local_48;
  Operand_ local_40;
  
  if (invokeNode->field_0xf5 == -1) {
    return 0;
  }
  this_00 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  if (((this_00->super_BaseEmitter)._environment._arch & k32BitMask) != kUnknown) {
    return 0;
  }
  uVar6 = (ulong)(byte)invokeNode->field_0xf4;
  cVar5 = '\x01';
  if (invokeNode->field_0x81 == ' ') {
    if (uVar6 == 0) {
      uVar3 = 0;
    }
    else {
      puVar9 = &invokeNode->field_0x11c;
      uVar8 = 0;
      uVar3 = 0;
      do {
        if (uVar8 == 0x20) goto LAB_0014c55c;
        lVar7 = 0;
        do {
          uVar1 = *(uint *)(puVar9 + lVar7 * 4);
          if (uVar1 == 0) break;
          if ((uVar1 >> 8 & 1) != 0) {
            if (0x1fffffff < uVar1) {
              emitPreCall();
              goto LAB_0014c557;
            }
            uVar3 = uVar3 + ((*(uint *)(_archTraits + (ulong)(uVar1 >> 0x18) * 4 + 0xec) & 0xf00) ==
                            0x100);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        uVar8 = uVar8 + 1;
        puVar9 = puVar9 + 0x10;
      } while (uVar8 != uVar6);
    }
    if (uVar3 == 0) {
      EVar4 = BaseEmitter::_emitI(&this_00->super_BaseEmitter,0x6a8,(Operand_ *)regs::eax,
                                  (Operand_ *)regs::eax);
    }
    else {
      local_58._signature._bits = 4;
      local_58._baseId = 0;
      local_58._data[1] = 0;
      local_58._data[0] = uVar3;
      EVar4 = BaseEmitter::_emitI(&this_00->super_BaseEmitter,0x1b7,(Operand_ *)regs::eax,&local_58)
      ;
    }
    if (EVar4 != 0) goto LAB_0014c53a;
  }
  else {
    EVar4 = 3;
    if (invokeNode->field_0x81 != '!') goto LAB_0014c53a;
    cVar5 = '\r';
    EVar4 = 3;
    if (uVar6 != 0) {
      puVar9 = &invokeNode->field_0x11c;
      uVar8 = 0;
      local_48 = uVar6;
      do {
        if (uVar8 == 0x20) goto LAB_0014c561;
        lVar7 = 0;
        do {
          uVar3 = *(uint *)(puVar9 + lVar7 * 4);
          cVar5 = '\0';
          if (uVar3 == 0) {
            cVar5 = '\x10';
            bVar10 = false;
          }
          else {
            bVar10 = true;
            if ((uVar3 >> 8 & 1) != 0) {
              if (0x1fffffff < uVar3) goto LAB_0014c557;
              if ((*(uint *)(_archTraits + (ulong)(uVar3 >> 0x18) * 4 + 0xec) & 0xf00) == 0x100) {
                local_58._baseId._0_1_ = (&invokeNode->field_0xb4)[uVar8];
                local_58._signature._bits = 0x8000039;
                local_58._baseId._1_3_ = 0;
                local_58._data[0] = 0;
                local_58._data[1] = 0;
                local_40._baseId = uVar3 >> 0x10 & 0xff;
                local_40._signature._bits = 0x10000161;
                local_40._data[0] = 0;
                local_40._data[1] = 0;
                instId = 0x4c0;
                if ((this->_emitHelper)._avxEnabled == false) {
                  instId = 0x1d3;
                }
                EVar2 = BaseEmitter::_emitI(&((this->super_BaseRAPass).super_FuncPass.super_Pass._cb
                                             )->super_BaseEmitter,instId,&local_58,&local_40);
                bVar10 = EVar2 == 0;
                cVar5 = !bVar10;
                if (!bVar10) {
                  EVar4 = EVar2;
                }
              }
            }
          }
          if (!bVar10) goto LAB_0014c433;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        cVar5 = '\x10';
LAB_0014c433:
        if (cVar5 != '\x10') goto LAB_0014c531;
        uVar8 = uVar8 + 1;
        puVar9 = puVar9 + 0x10;
      } while (uVar8 != local_48);
      cVar5 = '\r';
    }
LAB_0014c531:
    if (cVar5 != '\r') goto LAB_0014c53a;
  }
  cVar5 = '\0';
LAB_0014c53a:
  if (cVar5 == '\0') {
    return 0;
  }
  return EVar4;
LAB_0014c557:
  emitPreCall();
LAB_0014c55c:
  emitPreCall();
LAB_0014c561:
  emitPreCall();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

Error X86RAPass::emitPreCall(InvokeNode* invokeNode) noexcept {
  if (invokeNode->detail().hasVarArgs() && cc()->is64Bit()) {
    const FuncDetail& fd = invokeNode->detail();
    uint32_t argCount = invokeNode->argCount();

    switch (invokeNode->detail().callConv().id()) {
      case CallConvId::kX64SystemV: {
        // AL register contains the number of arguments passed in XMM register(s).
        uint32_t n = 0;
        for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
          const FuncValuePack& argPack = fd.argPack(argIndex);
          for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
            const FuncValue& arg = argPack[valueIndex];
            if (!arg)
              break;

            if (arg.isReg() && Reg::groupOf(arg.regType()) == RegGroup::kVec)
              n++;
          }
        }

        if (!n)
          ASMJIT_PROPAGATE(cc()->xor_(eax, eax));
        else
          ASMJIT_PROPAGATE(cc()->mov(eax, n));
        break;
      }

      case CallConvId::kX64Windows: {
        // Each double-precision argument passed in XMM must be also passed in GP.
        for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
          const FuncValuePack& argPack = fd.argPack(argIndex);
          for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
            const FuncValue& arg = argPack[valueIndex];
            if (!arg)
              break;

            if (arg.isReg() && Reg::groupOf(arg.regType()) == RegGroup::kVec) {
              Gp dst = gpq(fd.callConv().passedOrder(RegGroup::kGp)[argIndex]);
              Xmm src = xmm(arg.regId());
              ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovq, Inst::kIdVmovq), dst, src));
            }
          }
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }
  }

  return kErrorOk;
}